

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedNumber *FN)

{
  uint uVar1;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  SmallString<16U> Buffer;
  raw_svector_ostream Stream;
  
  if (FN->Hex == true) {
    uVar1 = (uint)FN->HexPrefix * 2;
    if (FN->Upper == false) {
      uVar1 = (uint)FN->HexPrefix * 2 + 1;
    }
    Width.Storage._8_8_ = in_R9;
    Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer = (AlignedCharArray<8UL,_8UL>)0x1;
    llvm::write_hex((llvm *)this,(raw_ostream *)FN->HexValue,(ulong)uVar1,FN->Width,Width);
  }
  else {
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX =
         &Buffer.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x10;
    raw_svector_ostream::raw_svector_ostream(&Stream,(SmallVectorImpl<char> *)&Buffer);
    write_integer((raw_ostream *)&Stream,FN->DecValue,0,Integer);
    uVar1 = FN->Width -
            Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
    if (Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size <= FN->Width && uVar1 != 0) {
      indent(this,uVar1);
    }
    operator<<(this,(SmallVectorImpl<char> *)&Buffer);
    ~raw_ostream((raw_ostream *)&Stream);
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Buffer);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedNumber &FN) {
  if (FN.Hex) {
    HexPrintStyle Style;
    if (FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixUpper;
    else if (FN.Upper && !FN.HexPrefix)
      Style = HexPrintStyle::Upper;
    else if (!FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixLower;
    else
      Style = HexPrintStyle::Lower;
    llvm::write_hex(*this, FN.HexValue, Style, FN.Width);
  } else {
    llvm::SmallString<16> Buffer;
    llvm::raw_svector_ostream Stream(Buffer);
    llvm::write_integer(Stream, FN.DecValue, 0, IntegerStyle::Integer);
    if (Buffer.size() < FN.Width)
      indent(FN.Width - Buffer.size());
    (*this) << Buffer;
  }
  return *this;
}